

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_sysprof.c
# Opt level: O3

int lj_sysprof_set_on_stop(luam_Sysprof_on_stop on_stop)

{
  int iVar1;
  
  iVar1 = 1;
  if ((on_stop != (luam_Sysprof_on_stop)0x0) && (sysprof.state == 0)) {
    iVar1 = 0;
    sysprof.on_stop = on_stop;
    if ((sysprof.backtracer != (luam_Sysprof_backtracer)0x0) &&
       (sysprof.writer != (luam_Sysprof_writer)0x0)) {
      sysprof.state = 0;
    }
  }
  return iVar1;
}

Assistant:

int lj_sysprof_set_on_stop(luam_Sysprof_on_stop on_stop) {
  struct sysprof *sp = &sysprof;

  if (sp->state != SPS_IDLE || on_stop == NULL)
    return PROFILE_ERRUSE;

  sp->on_stop = on_stop;
  if (!is_unconfigured(sp)) {
    sp->state = SPS_IDLE;
  }
  return PROFILE_SUCCESS;
}